

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
::clear(Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
        *this,ID_index rowIndex)

{
  long lVar1;
  long *plVar2;
  node_ptr plVar3;
  node_ptr plVar4;
  node_ptr next;
  iterator __position;
  void *pvVar5;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>
  *entry;
  key_type local_20;
  
  local_20 = (key_type)operator_new(0x20);
  (local_20->super_Entry_column_index_option).columnIndex_ = 0xffffffff;
  (local_20->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (local_20->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  local_20->rowIndex_ = rowIndex;
  __position = std::
               _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*,_std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>,_Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>::EntryPointerComp,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)1,_true,_false,_true>_>_>_*>_>
               ::find(&(this->column_)._M_t,&local_20);
  if ((_Rb_tree_header *)__position._M_node == &(this->column_)._M_t._M_impl.super__Rb_tree_header)
  goto LAB_001b9a53;
  pvVar5 = *(void **)(__position._M_node + 1);
  if ((this->super_Row_access_option).rows_ == (Row_container *)0x0) {
LAB_001b9a21:
    if (pvVar5 == (void *)0x0) {
      pvVar5 = (void *)0x0;
    }
    else {
      lVar1 = *(long *)((long)pvVar5 + 8);
      if (lVar1 != 0) {
        plVar2 = *(long **)((long)pvVar5 + 0x10);
        *plVar2 = lVar1;
        *(long **)(lVar1 + 8) = plVar2;
      }
    }
  }
  else {
    lVar1 = *(long *)((long)pvVar5 + 8);
    if (lVar1 != 0) {
      plVar2 = *(long **)((long)pvVar5 + 0x10);
      *plVar2 = lVar1;
      *(long **)(lVar1 + 8) = plVar2;
      *(undefined8 *)((long)pvVar5 + 8) = 0;
      *(undefined8 *)((long)pvVar5 + 0x10) = 0;
      pvVar5 = *(void **)(__position._M_node + 1);
      goto LAB_001b9a21;
    }
  }
  operator_delete(pvVar5,0x20);
  std::
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>*>>
  ::erase_abi_cxx11_((_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>*,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>*>,Gudhi::persistence_matrix::Set_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>::EntryPointerComp,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)1,true,false,true>>>*>>
                      *)&this->column_,(const_iterator)__position._M_node);
LAB_001b9a53:
  if ((local_20 != (key_type)0x0) &&
     (plVar3 = (local_20->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
     plVar3 != (node_ptr)0x0)) {
    plVar4 = (local_20->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
    plVar4->next_ = plVar3;
    plVar3->prev_ = plVar4;
  }
  operator_delete(local_20,0x20);
  return;
}

Assistant:

inline void Set_column<Master_matrix>::clear(ID_index rowIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  auto entry = entryPool_->construct(rowIndex);
  auto it = column_.find(entry);
  if (it != column_.end()) {
    _delete_entry(it);
  }
  entryPool_->destroy(entry);
}